

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

FabOnDisk *
amrex::VisMF::Write(FabOnDisk *__return_storage_ptr__,FArrayBox *fab,string *filename,ostream *os,
                   Long *bytes)

{
  Long LVar1;
  
  LVar1 = FileOffset(os);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  __return_storage_ptr__->m_head = LVar1;
  FArrayBox::writeOn(fab,os);
  LVar1 = FileOffset(os);
  *bytes = *bytes + (LVar1 - __return_storage_ptr__->m_head);
  return __return_storage_ptr__;
}

Assistant:

VisMF::FabOnDisk
VisMF::Write (const FArrayBox&   fab,
              const std::string& filename,
              std::ostream&      os,
              Long&              bytes)
{
//    BL_PROFILE("VisMF::Write_fab");
    VisMF::FabOnDisk fab_on_disk(filename, VisMF::FileOffset(os));

    fab.writeOn(os);
    //
    // Add in the number of bytes in the FAB including the FAB header.
    //
    bytes += (VisMF::FileOffset(os) - fab_on_disk.m_head);

    return fab_on_disk;
}